

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O1

float Gia_IffObjTimeTwo(Iff_Man_t *p,int iObj,int *piFanin,float DelayMin)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  *piFanin = -1;
  if (-1 < iObj) {
    lVar6 = 0;
    while( true ) {
      pGVar2 = p->pGia;
      iVar1 = pGVar2->vMapping->nSize;
      if (iVar1 <= iObj) break;
      piVar3 = pGVar2->vMapping->pArray;
      lVar5 = (long)piVar3[(uint)iObj];
      if ((lVar5 < 0) || (iVar1 <= piVar3[(uint)iObj])) break;
      if (piVar3[lVar5] <= lVar6) {
        return DelayMin;
      }
      iVar1 = piVar3[lVar5 + lVar6 + 1];
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(pGVar2->pObjs + iVar1) & 0x9fffffff) != 0) {
        fVar7 = Gia_IffObjTimeOne(p,iObj,iVar1,-1);
        iVar4 = Gia_IffObjCount(p->pGia,iObj,iVar1,-1);
        if (p->pLib->LutMax < iVar4) {
          __assert_fail("nSize <= p->pLib->LutMax",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                        ,0xb0,"float Gia_IffObjTimeTwo(Iff_Man_t *, int, int *, float)");
        }
        fVar7 = fVar7 + p->pLib->pLutDelays[iVar4][0];
        if (fVar7 < DelayMin) {
          *piFanin = iVar1;
          DelayMin = fVar7;
        }
      }
      lVar6 = lVar6 + 1;
      if (iObj < 0) break;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

float Gia_IffObjTimeTwo( Iff_Man_t * p, int iObj, int * piFanin, float DelayMin )
{
    int i, iFanin, nSize;
    float This;
    *piFanin = -1;
    Gia_LutForEachFanin( p->pGia, iObj, iFanin, i )
    {
        if ( Gia_ObjIsCi(Gia_ManObj(p->pGia, iFanin)) )
            continue;
        This = Gia_IffObjTimeOne( p, iObj, iFanin, -1 );
        nSize = Gia_IffObjCount( p->pGia, iObj, iFanin, -1 );
        assert( nSize <= p->pLib->LutMax );
        This += p->pLib->pLutDelays[nSize][0];
        if ( DelayMin > This )
        {
            DelayMin = This;
            *piFanin = iFanin;
        }
    }
    return DelayMin;
}